

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall dmlc::JSONReader::ReadNumber<long>(JSONReader *this,long *out_value)

{
  ulong uVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  string local_1d0;
  LogMessageFatal local_1a0;
  long *local_18;
  long *out_value_local;
  JSONReader *this_local;
  
  local_18 = out_value;
  out_value_local = (long *)this;
  std::istream::operator>>(this->is_,out_value);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x2e0);
    poVar2 = LogMessageFatal::stream_abi_cxx11_(&local_1a0);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: !is_->fail()");
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,"Error at");
    line_info_abi_cxx11_(&local_1d0,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_1d0);
    std::operator<<(poVar3,", Expect number");
    std::__cxx11::string::~string((string *)&local_1d0);
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  return;
}

Assistant:

inline void JSONReader::ReadNumber(ValueType *out_value) {
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  *is_ >> *out_value;
  CHECK(!is_->fail())
      << "Error at" << line_info()
      << ", Expect number";
#else
  char *endptr;
  const char *icstr = is_->c_str();
  unsigned number = strtol(icstr, &endptr, 10);
  is_->erase(0, endptr - icstr);
  *out_value = static_cast<ValueType>(number);
#endif
}